

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  ReadableDirectory *extraout_RDX;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar1;
  Maybe<kj::OwnFd> local_40;
  Maybe<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_> local_38;
  String *local_28;
  DiskHandle *this_local;
  PathPtr path_local;
  
  this_local = (DiskHandle *)path.parts.size_;
  local_28 = path.parts.ptr;
  path_local.parts.size_ = (size_t)this;
  tryOpenSubdirInternal((DiskHandle *)&local_40,path);
  Maybe<kj::OwnFd>::map<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_(&)(kj::OwnFd)>
            ((Maybe<kj::OwnFd> *)&local_38,
             (_func_Own<kj::ReadableDirectory,_std::nullptr_t>_OwnFd *)&local_40);
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>::Maybe<kj::ReadableDirectory>
            ((Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> *)this,&local_38);
  Maybe<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_>::~Maybe(&local_38);
  Maybe<kj::OwnFd>::~Maybe(&local_40);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }